

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IterNextFrom(Fts5IndexIter *pIndexIter,i64 iMatch)

{
  int iVar1;
  Fts5Iter *pIter;
  i64 iMatch_local;
  Fts5IndexIter *pIndexIter_local;
  
  fts5MultiIterNextFrom((Fts5Index *)pIndexIter[1].iRowid,(Fts5Iter *)pIndexIter,iMatch);
  iVar1 = fts5IndexReturn((Fts5Index *)pIndexIter[1].iRowid);
  return iVar1;
}

Assistant:

static int sqlite3Fts5IterNextFrom(Fts5IndexIter *pIndexIter, i64 iMatch){
  Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
  fts5MultiIterNextFrom(pIter->pIndex, pIter, iMatch);
  return fts5IndexReturn(pIter->pIndex);
}